

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

string * wabt::(anonymous_namespace)::MakeDollarName_abi_cxx11_(string_view name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator<char> local_72;
  allocator<char> local_71;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"$",&local_71);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_60,&local_70,&local_72);
  std::operator+(in_RDI,&local_40,&local_60);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return in_RDI;
}

Assistant:

static std::string MakeDollarName(std::string_view name) {
  return std::string("$") + std::string(name);
}